

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

void __thiscall
slang::SourceManager::addDiagnosticDirective
          (SourceManager *this,SourceLocation location,string_view name,DiagnosticSeverity severity)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  DiagnosticDirectiveInfo *pDVar6;
  int iVar7;
  SourceLocation SVar8;
  ulong pos0;
  uint uVar9;
  ulong uVar10;
  const_iterator __position;
  ulong hash;
  pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
  *ppVar11;
  ulong uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  undefined1 auVar17 [16];
  size_t offset;
  unique_lock<std::shared_mutex> lock;
  locator res;
  try_emplace_args_t local_91;
  BufferID local_90;
  DiagnosticSeverity local_8c;
  ulong local_88;
  flat_hash_map<BufferID,_std::vector<DiagnosticDirectiveInfo>_> *local_80;
  ulong local_78;
  ulong local_70;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  unique_lock<std::shared_mutex> local_58;
  locator local_48;
  
  local_68._M_str = name._M_str;
  local_68._M_len = name._M_len;
  local_58._M_owns = false;
  local_8c = severity;
  local_58._M_device = &this->mutex;
  std::unique_lock<std::shared_mutex>::lock(&local_58);
  local_58._M_owns = true;
  SVar8 = getFullyExpandedLocImpl<std::unique_lock<std::shared_mutex>_>(this,location,&local_58);
  local_88 = (ulong)SVar8 >> 0x1c;
  local_90.id = SVar8._0_4_ & 0xfffffff;
  local_80 = &this->diagDirectives;
  hash = SUB168(ZEXT416(local_90.id) * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(ZEXT416(local_90.id) * ZEXT816(0x9e3779b97f4a7c15),0);
  pos0 = hash >> ((byte)(this->diagDirectives).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
                        .arrays.groups_size_index & 0x3f);
  pgVar4 = (this->diagDirectives).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
           .arrays.groups_;
  uVar3 = *(undefined4 *)
           (boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word + (hash & 0xff) * 4);
  ppVar5 = (this->diagDirectives).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
           .arrays.elements_;
  local_78 = (this->diagDirectives).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
             .arrays.groups_size_mask;
  uVar10 = 0;
  uVar12 = pos0;
  do {
    local_70 = uVar10;
    pgVar2 = pgVar4 + uVar12;
    uVar13 = (uchar)uVar3;
    auVar17[0] = -(pgVar2->m[0].n == uVar13);
    uVar14 = (uchar)((uint)uVar3 >> 8);
    auVar17[1] = -(pgVar2->m[1].n == uVar14);
    uVar15 = (uchar)((uint)uVar3 >> 0x10);
    auVar17[2] = -(pgVar2->m[2].n == uVar15);
    uVar16 = (uchar)((uint)uVar3 >> 0x18);
    auVar17[3] = -(pgVar2->m[3].n == uVar16);
    auVar17[4] = -(pgVar2->m[4].n == uVar13);
    auVar17[5] = -(pgVar2->m[5].n == uVar14);
    auVar17[6] = -(pgVar2->m[6].n == uVar15);
    auVar17[7] = -(pgVar2->m[7].n == uVar16);
    auVar17[8] = -(pgVar2->m[8].n == uVar13);
    auVar17[9] = -(pgVar2->m[9].n == uVar14);
    auVar17[10] = -(pgVar2->m[10].n == uVar15);
    auVar17[0xb] = -(pgVar2->m[0xb].n == uVar16);
    auVar17[0xc] = -(pgVar2->m[0xc].n == uVar13);
    auVar17[0xd] = -(pgVar2->m[0xd].n == uVar14);
    auVar17[0xe] = -(pgVar2->m[0xe].n == uVar15);
    auVar17[0xf] = -(pgVar2->m[0xf].n == uVar16);
    for (uVar9 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe); uVar9 != 0;
        uVar9 = uVar9 - 1 & uVar9) {
      iVar7 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
        }
      }
      if (local_90.id == *(uint *)((long)&ppVar5[uVar12 * 0xf].first.id + (ulong)(uint)(iVar7 << 5))
         ) {
        ppVar11 = (pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
                   *)((long)&ppVar5[uVar12 * 0xf].first.id + (ulong)(uint)(iVar7 << 5));
        goto LAB_0014d513;
      }
    }
    if ((pgVar4[uVar12].m[0xf].n &
        *(byte *)((long)&boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::
                         is_not_overflowed(unsigned_long)::shift + (ulong)((uint)hash & 7))) == 0)
    break;
    uVar12 = uVar12 + local_70 + 1 & local_78;
    uVar10 = local_70 + 1;
  } while (local_70 + 1 <= local_78);
  ppVar11 = (pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
             *)0x0;
LAB_0014d513:
  if (ppVar11 ==
      (pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
       *)0x0) {
    if ((this->diagDirectives).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
        .size_ctrl.size <
        (this->diagDirectives).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::BufferID>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>
                  *)local_80,(arrays_type *)local_80,pos0,hash,&local_91,&local_90);
      psVar1 = &(this->diagDirectives).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
      ppVar11 = local_48.p;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::BufferID>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>
                  *)local_80,hash,&local_91,&local_90);
      ppVar11 = local_48.p;
    }
  }
  __position._M_current =
       (ppVar11->second).
       super__Vector_base<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pDVar6 = (ppVar11->second).
           super__Vector_base<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((__position._M_current == pDVar6) || (pDVar6[-1].offset <= local_88)) {
    std::
    vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
    ::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&,unsigned_long&,slang::DiagnosticSeverity&>
              ((vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
                *)&ppVar11->second,&local_68,&local_88,&local_8c);
  }
  else {
    uVar10 = (long)pDVar6 - (long)__position._M_current >> 5;
    while (uVar12 = uVar10, 0 < (long)uVar12) {
      uVar10 = uVar12 >> 1;
      if (__position._M_current[uVar10].offset <= local_88) {
        __position._M_current = __position._M_current + uVar10 + 1;
        uVar10 = ~uVar10 + uVar12;
      }
    }
    std::
    vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
    ::
    _M_emplace_aux<std::basic_string_view<char,std::char_traits<char>>&,unsigned_long&,slang::DiagnosticSeverity&>
              ((vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
                *)&ppVar11->second,__position,&local_68,&local_88,&local_8c);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_58);
  return;
}

Assistant:

void SourceManager::addDiagnosticDirective(SourceLocation location, std::string_view name,
                                           DiagnosticSeverity severity) {
    std::unique_lock<std::shared_mutex> lock(mutex);
    SourceLocation fileLocation = getFullyExpandedLocImpl(location, lock);

    size_t offset = fileLocation.offset();
    auto& vec = diagDirectives[fileLocation.buffer()];
    if (vec.empty() || offset >= vec.back().offset)
        vec.emplace_back(name, offset, severity);
    else {
        // Keep the list in sorted order. Typically new additions should be at the end,
        // in which case we'll hit the condition above, but just in case we will do the
        // full search and insert here.
        vec.emplace(std::ranges::upper_bound(vec, offset, {}, &DiagnosticDirectiveInfo::offset),
                    name, offset, severity);
    }
}